

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
r_code::list<r_exec::HLPController::EEntry>::push_front_free_cell
          (list<r_exec::HLPController::EEntry> *this,EEntry *t)

{
  long lVar1;
  pointer pcVar2;
  uint64_t uVar3;
  
  lVar1 = this->free_cells;
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar1;
  this->free_cells = pcVar2->next;
  this->free_cell_count = this->free_cell_count - 1;
  core::P<r_exec::_Fact>::operator=(&(pcVar2->data).evidence,&t->evidence);
  uVar3 = t->before;
  (pcVar2->data).after = t->after;
  (pcVar2->data).before = uVar3;
  (pcVar2->data).confidence = t->confidence;
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<r_exec::HLPController::EEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::EEntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2[lVar1].next = this->used_cells_head;
  pcVar2[lVar1].prev = -1;
  this->used_cells_head = lVar1;
  return;
}

Assistant:

void push_front_free_cell(const T &t)
    {
        int64_t free = free_cells;
        free_cells = cells[free_cells].next;
        --free_cell_count;
        cells[free].data = t;
        cells[free].next = used_cells_head;
        cells[free].prev = null;
        used_cells_head = free;
    }